

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall fizplex::LPTest_AddAndEditColumn_Test::TestBody(LPTest_AddAndEditColumn_Test *this)

{
  undefined1 uVar1;
  LP *this_00;
  char *message;
  AssertionResult gtest_ar;
  LP lp;
  double in_stack_000002e0;
  double in_stack_000002e8;
  char *in_stack_000002f0;
  char *in_stack_000002f8;
  double in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  size_t in_stack_ffffffffffffff28;
  LP *in_stack_ffffffffffffff30;
  AssertHelper local_c0;
  Message local_b8;
  LP *in_stack_ffffffffffffff50;
  
  LP::LP(in_stack_ffffffffffffff50);
  LP::add_column(in_stack_ffffffffffffff30,(ColType)(in_stack_ffffffffffffff28 >> 0x20),
                 (double)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,9.23641891062127e-318);
  this_00 = (LP *)LP::column_header(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  (this_00->A).cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40091eb851eb851f;
  LP::column_header(this_00,in_stack_ffffffffffffff28);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1c8766);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x1c87b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c87f2);
  LP::~LP((LP *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  return;
}

Assistant:

TEST(LPTest, AddAndEditColumn) {
  LP lp;
  lp.add_column(ColType::Bounded, -1.0, 2.0);
  lp.column_header(0u).upper = 3.14;
  EXPECT_DOUBLE_EQ(3.14, lp.column_header(0u).upper);
}